

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall Assimp::ColladaLoader::ConvertPath(ColladaLoader *this,aiString *ss)

{
  char *__dest;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  byte bVar7;
  uint uVar8;
  ulong __n;
  char mychar [3];
  char local_1a [2];
  
  __dest = ss->data;
  if (*(int *)(ss->data + 3) == 0x2f2f3a65 && *(int *)ss->data == 0x656c6966) {
    uVar8 = ss->length - 7;
    ss->length = uVar8;
    memmove(__dest,ss->data + 7,(ulong)uVar8);
    ss->data[uVar8] = '\0';
  }
  if (*__dest == '/') {
    iVar1 = isalpha((int)ss->data[1]);
    __n = (ulong)ss->length;
    if ((iVar1 != 0) && (ss->data[2] == ':')) {
      uVar8 = ss->length - 1;
      __n = (ulong)uVar8;
      ss->length = uVar8;
      memmove(__dest,ss->data + 1,__n);
      ss->data[__n] = '\0';
    }
  }
  else {
    __n = (ulong)ss->length;
  }
  pcVar2 = __dest;
  if ((int)__n == 0) {
LAB_003eb756:
    *pcVar2 = '\0';
    ss->length = (int)pcVar2 - (int)__dest;
    return;
  }
  pcVar5 = ss->data + __n;
  pcVar3 = __dest;
LAB_003eb6b9:
  if ((*pcVar3 == '%') && (pcVar4 = pcVar3 + 3, pcVar4 < pcVar5)) {
    cVar6 = pcVar3[1];
    local_1a[0] = pcVar3[2];
    local_1a[1] = 0;
    bVar7 = 0;
    pcVar3 = local_1a;
    do {
      if ((byte)(cVar6 - 0x30U) < 10) {
        bVar7 = cVar6 - 0x30U | bVar7 << 4;
      }
      else if ((byte)(cVar6 + 0xbfU) < 6) {
        bVar7 = cVar6 + 0xbfU + bVar7 * '\x10' + 10;
      }
      else {
        if (5 < (byte)(cVar6 + 0x9fU)) goto LAB_003eb73f;
        bVar7 = cVar6 + 0x9fU + bVar7 * '\x10' + 10;
      }
      cVar6 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while( true );
  }
  pcVar4 = pcVar3 + 1;
  *pcVar2 = *pcVar3;
  goto LAB_003eb745;
LAB_003eb73f:
  *pcVar2 = bVar7;
LAB_003eb745:
  pcVar2 = pcVar2 + 1;
  pcVar5 = __dest + ss->length;
  pcVar3 = pcVar4;
  if (pcVar4 == pcVar5) goto LAB_003eb756;
  goto LAB_003eb6b9;
}

Assistant:

void ColladaLoader::ConvertPath(aiString& ss)
{
    // TODO: collada spec, p 22. Handle URI correctly.
    // For the moment we're just stripping the file:// away to make it work.
    // Windows doesn't seem to be able to find stuff like
    // 'file://..\LWO\LWO2\MappingModes\earthSpherical.jpg'
    if (0 == strncmp(ss.data, "file://", 7))
    {
        ss.length -= 7;
        memmove(ss.data, ss.data + 7, ss.length);
        ss.data[ss.length] = '\0';
    }

    // Maxon Cinema Collada Export writes "file:///C:\andsoon" with three slashes...
    // I need to filter it without destroying linux paths starting with "/somewhere"
#if defined( _MSC_VER )
    if (ss.data[0] == '/' && isalpha((unsigned char)ss.data[1]) && ss.data[2] == ':') {
#else
    if (ss.data[0] == '/' && isalpha(ss.data[1]) && ss.data[2] == ':') {
#endif
        --ss.length;
        ::memmove(ss.data, ss.data + 1, ss.length);
        ss.data[ss.length] = 0;
    }

    // find and convert all %xy special chars
    char* out = ss.data;
    for (const char* it = ss.data; it != ss.data + ss.length; /**/)
    {
        if (*it == '%' && (it + 3) < ss.data + ss.length)
        {
            // separate the number to avoid dragging in chars from behind into the parsing
            char mychar[3] = { it[1], it[2], 0 };
            size_t nbr = strtoul16(mychar);
            it += 3;
            *out++ = (char)(nbr & 0xFF);
        }
        else
        {
            *out++ = *it++;
        }
    }

    // adjust length and terminator of the shortened string
    *out = 0;
    ss.length = (ptrdiff_t)(out - ss.data);
}

// ------------------------------------------------------------------------------------------------
// Reads a float value from an accessor and its data array.
ai_real ColladaLoader::ReadFloat(const Collada::Accessor& pAccessor, const Collada::Data& pData, size_t pIndex, size_t pOffset) const
{
    // FIXME: (thom) Test for data type here in every access? For the moment, I leave this to the caller
    size_t pos = pAccessor.mStride * pIndex + pAccessor.mOffset + pOffset;
    ai_assert(pos < pData.mValues.size());
    return pData.mValues[pos];
}

// ------------------------------------------------------------------------------------------------
// Reads a string value from an accessor and its data array.
const std::string& ColladaLoader::ReadString(const Collada::Accessor& pAccessor, const Collada::Data& pData, size_t pIndex) const
{
    size_t pos = pAccessor.mStride * pIndex + pAccessor.mOffset;
    ai_assert(pos < pData.mStrings.size());
    return pData.mStrings[pos];
}

// ------------------------------------------------------------------------------------------------
// Collects all nodes into the given array
void ColladaLoader::CollectNodes(const aiNode* pNode, std::vector<const aiNode*>& poNodes) const
{
    poNodes.push_back(pNode);
    for (size_t a = 0; a < pNode->mNumChildren; ++a) {
        CollectNodes(pNode->mChildren[a], poNodes);
    }
}

// ------------------------------------------------------------------------------------------------
// Finds a node in the collada scene by the given name
const Collada::Node* ColladaLoader::FindNode(const Collada::Node* pNode, const std::string& pName) const
{
    if (pNode->mName == pName || pNode->mID == pName)
        return pNode;

    for (size_t a = 0; a < pNode->mChildren.size(); ++a)
    {
        const Collada::Node* node = FindNode(pNode->mChildren[a], pName);
        if (node)
            return node;
    }

    return NULL;
}

// ------------------------------------------------------------------------------------------------
// Finds a node in the collada scene by the given SID
const Collada::Node* ColladaLoader::FindNodeBySID( const Collada::Node* pNode, const std::string& pSID) const {
    if (nullptr == pNode) {
        return nullptr;
    }

    if (pNode->mSID == pSID) {
        return pNode;
    }

    for( size_t a = 0; a < pNode->mChildren.size(); ++a) {
        const Collada::Node* node = FindNodeBySID( pNode->mChildren[a], pSID);
        if (node) {
            return node;
        }
    }

    return nullptr;
}

// ------------------------------------------------------------------------------------------------
// Finds a proper unique name for a node derived from the collada-node's properties.
// The name must be unique for proper node-bone association.
std::string ColladaLoader::FindNameForNode(const Collada::Node* pNode)
{
    // If explicitly requested, just use the collada name.
    if (useColladaName)
    {
        if (!pNode->mName.empty()) {
            return pNode->mName;
        }
        else {
            return format() << "$ColladaAutoName$_" << mNodeNameCounter++;
        }
    }
    else
    {
        // Now setup the name of the assimp node. The collada name might not be
        // unique, so we use the collada ID.
        if (!pNode->mID.empty())
            return pNode->mID;
        else if (!pNode->mSID.empty())
            return pNode->mSID;
        else
        {
            // No need to worry. Unnamed nodes are no problem at all, except
            // if cameras or lights need to be assigned to them.
            return format() << "$ColladaAutoName$_" << mNodeNameCounter++;
        }
    }
}

}